

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall DReachabilityPropagator::checkFinalSatisfied(DReachabilityPropagator *this)

{
  BoolView *pBVar1;
  bool bVar2;
  ostream *poVar3;
  size_type __n;
  long lVar4;
  long lVar5;
  reference rVar6;
  allocator_type local_5a;
  bool local_59;
  vector<bool,_std::allocator<bool>_> v;
  
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&v,(long)(int)(this->super_GraphPropagator).vs.sz,&local_59,&local_5a);
  verificationDFS(this,this->root,&v);
  lVar5 = 0;
  __n = 0;
  do {
    lVar4 = (long)(int)(this->super_GraphPropagator).vs.sz;
    if (lVar4 <= (long)__n) {
LAB_001a6fd5:
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&v.super__Bvector_base<std::allocator<bool>_>);
      return lVar4 <= (long)__n;
    }
    pBVar1 = (this->super_GraphPropagator).vs.data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar5)] != '\0') {
      bVar2 = BoolView::isTrue((BoolView *)
                               ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar5))
      ;
      if (bVar2) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&v,__n);
        if ((*rVar6._M_p & rVar6._M_mask) == 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "DreachabilityPropagator not satisfied (cannot reach node ");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)__n);
          poVar3 = std::operator<<(poVar3,") ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/dconnected.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x363);
          std::operator<<(poVar3,'\n');
          goto LAB_001a6fd5;
        }
      }
    }
    __n = __n + 1;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

bool DReachabilityPropagator::checkFinalSatisfied() {
	std::vector<bool> v = std::vector<bool>(nbNodes(), false);
	verificationDFS(get_root_idx(), v);
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			assert(v[i]);
			if (!v[i]) {
				std::cerr << "DreachabilityPropagator not satisfied (cannot reach node " << i << ") "
									<< __FILE__ << ":" << __LINE__ << '\n';
				return false;
			}
		}
	}

	return true;
}